

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O1

void __thiscall amrex::ParmParse::get(ParmParse *this,char *name,IntVect *ptr,int ival)

{
  Table *table;
  allocator local_69;
  string local_68;
  string local_48;
  
  table = this->m_table;
  std::__cxx11::string::string((string *)&local_48,name,&local_69);
  prefixedName(&local_68,this,&local_48);
  anon_unknown_12::anon_unknown_0::sgetval<amrex::IntVect>(table,&local_68,ptr,ival,-1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
ParmParse::get (const char* name,
                IntVect&    ptr,
                int         ival) const
{
    sgetval(m_table, prefixedName(name),ptr,ival, LAST);
}